

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O3

parser_error parse_pit_innate_freq(parser *p)

{
  wchar_t wVar1;
  parser_error pVar2;
  void *pvVar3;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    wVar1 = parser_getint(p,"freq");
    pVar2 = PARSE_ERROR_INVALID_SPELL_FREQ;
    if (0xffffff9b < (uint)(wVar1 + L'\xffffff9b')) {
      *(uint *)((long)pvVar3 + 0x40) = (uint)(byte)(100 / (byte)wVar1);
      pVar2 = PARSE_ERROR_NONE;
    }
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_pit_innate_freq(struct parser *p) {
	struct pit_profile *pit = parser_priv(p);
	int pct;

	if (!pit)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	pct = parser_getint(p, "freq");
	if (pct < 1 || pct > 100)
		return PARSE_ERROR_INVALID_SPELL_FREQ;
	pit->freq_innate = 100 / pct;
	return PARSE_ERROR_NONE;
}